

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llex.c
# Opt level: O0

void save(LexState *ls,int c)

{
  Mbuffer *pMVar1;
  ulong uVar2;
  size_t sVar3;
  char *pcVar4;
  size_t newsize;
  Mbuffer *b;
  int c_local;
  LexState *ls_local;
  
  pMVar1 = ls->buff;
  if (pMVar1->buffsize < pMVar1->n + 1) {
    uVar2 = pMVar1->buffsize;
    if (0x5555555555555553 < uVar2) {
      lexerror(ls,"lexical element too long",0);
    }
    sVar3 = (uVar2 >> 1) + uVar2;
    pcVar4 = (char *)luaM_saferealloc_(ls->L,pMVar1->buffer,pMVar1->buffsize,sVar3);
    pMVar1->buffer = pcVar4;
    pMVar1->buffsize = sVar3;
  }
  sVar3 = pMVar1->n;
  pMVar1->n = sVar3 + 1;
  pMVar1->buffer[sVar3] = (char)c;
  return;
}

Assistant:

static void save (LexState *ls, int c) {
  Mbuffer *b = ls->buff;
  if (luaZ_bufflen(b) + 1 > luaZ_sizebuffer(b)) {
    size_t newsize = luaZ_sizebuffer(b);  /* get old size */;
    if (newsize >= (MAX_SIZE/3 * 2))  /* larger than MAX_SIZE/1.5 ? */
      lexerror(ls, "lexical element too long", 0);
    newsize += (newsize >> 1);  /* new size is 1.5 times the old one */
    luaZ_resizebuffer(ls->L, b, newsize);
  }
  b->buffer[luaZ_bufflen(b)++] = cast_char(c);
}